

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerModel.cpp
# Opt level: O0

string * __thiscall tiger::trains::models::PlayerModel::getName_abi_cxx11_(PlayerModel *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x28));
  return in_RDI;
}

Assistant:

const string PlayerModel::getName() const
{
    return name;
}